

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::StmtFileNameVisitor::visit(StmtFileNameVisitor *this,AssignStmt *stmt)

{
  bool bVar1;
  mapped_type *__in;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  AssignStmt *local_28;
  _Self local_20;
  AssignStmt *local_18;
  AssignStmt *stmt_local;
  StmtFileNameVisitor *this_local;
  
  local_28 = stmt;
  local_18 = stmt;
  stmt_local = (AssignStmt *)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
       ::find(this->stmt_fn_ln_,(key_type *)&local_28);
  local_38._8_8_ =
       std::
       map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
       ::end(this->stmt_fn_ln_);
  bVar1 = std::operator!=(&local_20,(_Self *)(local_38 + 8));
  if (bVar1) {
    local_38._0_8_ = local_18;
    __in = std::
           map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
           ::at(this->stmt_fn_ln_,(key_type *)local_38);
    std::tie<std::__cxx11::string,unsigned_int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
               (uint *)&this->filename);
    std::tuple<std::__cxx11::string&,unsigned_int&>::operator=
              ((tuple<std::__cxx11::string&,unsigned_int&> *)local_48,__in);
  }
  return;
}

Assistant:

void visit(AssignStmt *stmt) override {
        if (stmt_fn_ln_.find(stmt) != stmt_fn_ln_.end()) {
            std::tie(filename, ln) = stmt_fn_ln_.at(stmt);
        }
    }